

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O3

void idx2::Dealloc(chunk_cache *ChunkCache)

{
  allocator *paVar1;
  
  paVar1 = (ChunkCache->Bricks).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&ChunkCache->Bricks);
  (ChunkCache->Bricks).Size = 0;
  (ChunkCache->Bricks).Capacity = 0;
  paVar1 = (ChunkCache->BrickOffsets).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&ChunkCache->BrickOffsets);
  (ChunkCache->BrickOffsets).Size = 0;
  (ChunkCache->BrickOffsets).Capacity = 0;
  paVar1 = (ChunkCache->ChunkStream).Stream.Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&ChunkCache->ChunkStream);
  (ChunkCache->ChunkStream).BitPtr = (ChunkCache->ChunkStream).Stream.Data;
  (ChunkCache->ChunkStream).BitPos = 0;
  (ChunkCache->ChunkStream).BitBuf = 0;
  return;
}

Assistant:

void
Dealloc(chunk_cache* ChunkCache)
{
  Dealloc(&ChunkCache->Bricks);
  Dealloc(&ChunkCache->BrickOffsets);
  Dealloc(&ChunkCache->ChunkStream);
}